

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPMacAlgorithm::verifyFinal(OSSLEVPMacAlgorithm *this,ByteString *signature)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uchar *md;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  uint outLen;
  ByteString macResult;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ByteString *in_stack_ffffffffffffff80;
  HMAC_CTX *ctx;
  undefined4 in_stack_ffffffffffffff90;
  uint local_44 [16];
  bool local_1;
  ByteString *this_00;
  
  bVar1 = MacAlgorithm::verifyFinal(in_RDI,in_RSI);
  if (bVar1) {
    ByteString::ByteString((ByteString *)0x132530);
    iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xc])();
    this_00 = (ByteString *)CONCAT44(extraout_var,iVar2);
    uVar3 = EVP_MD_get_size(this_00);
    local_44[0] = uVar3;
    ByteString::resize(in_stack_ffffffffffffff80,
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    ctx = (HMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
    md = ByteString::operator[]
                   ((ByteString *)ctx,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    iVar2 = HMAC_Final(ctx,md,local_44);
    if (iVar2 == 0) {
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0xd0,"HMAC_Final failed");
      HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = false;
    }
    else {
      HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = ByteString::operator==
                          (this_00,(ByteString *)CONCAT44(uVar3,in_stack_ffffffffffffff90));
    }
    ByteString::~ByteString((ByteString *)0x132677);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPMacAlgorithm::verifyFinal(ByteString& signature)
{
	if (!MacAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString macResult;
	unsigned int outLen = EVP_MD_size(getEVPHash());
	macResult.resize(outLen);

	if (!HMAC_Final(curCTX, &macResult[0], &outLen))
	{
		ERROR_MSG("HMAC_Final failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	HMAC_CTX_free(curCTX);
	curCTX = NULL;

	return macResult == signature;
}